

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O3

bool __thiscall Jinx::Impl::Library::PropertyNameExists(Library *this,String *name)

{
  int iVar1;
  const_iterator cVar2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_propertyMutex);
  if (iVar1 == 0) {
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
            ::find(&(this->m_propertyNameTable)._M_t,name);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
    return (_Rb_tree_header *)cVar2._M_node !=
           &(this->m_propertyNameTable)._M_t._M_impl.super__Rb_tree_header;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

inline_t bool Library::PropertyNameExists(const String & name) const
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		return m_propertyNameTable.find(name) == m_propertyNameTable.end() ? false : true;
	}